

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

uint Abc_TtCanonicizeWrap
               (TtCanonicizeFunc func,Abc_TtHieMan_t *p,word *pTruth,int nVars,char *pCanonPerm,
               int flag)

{
  int nWords_00;
  int iVar1;
  char local_58 [8];
  char pCanonPerm2 [16];
  uint uCanonPhase2;
  uint uCanonPhase1;
  int nWords;
  int flag_local;
  char *pCanonPerm_local;
  int nVars_local;
  word *pTruth_local;
  Abc_TtHieMan_t *p_local;
  TtCanonicizeFunc func_local;
  
  nWords_00 = Abc_TtWordNum(nVars);
  Abc_TtNormalizeSmallTruth(pTruth,nVars);
  iVar1 = Abc_TtCountOnesInTruth(pTruth,nVars);
  if (iVar1 == nWords_00 << 5) {
    Abc_TtCopy(Abc_TtCanonicizeWrap::pTruth2,pTruth,nWords_00,1);
    pCanonPerm2._12_4_ = (*func)(p,pTruth,nVars,pCanonPerm,flag);
    pCanonPerm2._8_4_ = (*func)(p,Abc_TtCanonicizeWrap::pTruth2,nVars,local_58,flag);
    iVar1 = Abc_TtCompareRev(pTruth,Abc_TtCanonicizeWrap::pTruth2,nWords_00);
    if (iVar1 < 1) {
      func_local._4_1_ = pCanonPerm2[0xc];
      func_local._5_1_ = pCanonPerm2[0xd];
      func_local._6_1_ = pCanonPerm2[0xe];
      func_local._7_1_ = pCanonPerm2[0xf];
    }
    else {
      Abc_TtCopy(pTruth,Abc_TtCanonicizeWrap::pTruth2,nWords_00,0);
      memcpy(pCanonPerm,local_58,(long)nVars);
      func_local._4_1_ = pCanonPerm2[8];
      func_local._5_1_ = pCanonPerm2[9];
      func_local._6_1_ = pCanonPerm2[10];
      func_local._7_1_ = pCanonPerm2[0xb];
    }
  }
  else {
    func_local._4_4_ = (*func)(p,pTruth,nVars,pCanonPerm,flag);
  }
  return func_local._4_4_;
}

Assistant:

unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag)
{
    int nWords = Abc_TtWordNum(nVars);
    unsigned uCanonPhase1, uCanonPhase2;
    char pCanonPerm2[16];
    static word pTruth2[1024];

    Abc_TtNormalizeSmallTruth(pTruth, nVars);
    if (Abc_TtCountOnesInTruth(pTruth, nVars) != nWords * 32)
        return func(p, pTruth, nVars, pCanonPerm, flag);
    Abc_TtCopy(pTruth2, pTruth, nWords, 1);
    uCanonPhase1 = func(p, pTruth, nVars, pCanonPerm, flag);
    uCanonPhase2 = func(p, pTruth2, nVars, pCanonPerm2, flag);
    if (Abc_TtCompareRev(pTruth, pTruth2, nWords) <= 0)
        return uCanonPhase1;
    Abc_TtCopy(pTruth, pTruth2, nWords, 0);
    memcpy(pCanonPerm, pCanonPerm2, nVars);
    return uCanonPhase2;
}